

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np2_opna.cpp
# Opt level: O2

void __thiscall NP2OPNA<FM::OPNB>::setRate(NP2OPNA<FM::OPNB> *this,uint32_t rate,uint32_t clock)

{
  uint r;
  
  OPNChipBaseT<NP2OPNA<FM::OPNB>_>::setRate((OPNChipBaseT<NP2OPNA<FM::OPNB>_> *)this,rate,clock);
  r = 0xd013;
  if ((this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
      super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.super_OPNChipBase.m_family == OPNChip_OPNA) {
    r = 0xd8aa;
  }
  if ((this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
      super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_runningAtPcmRate != false) {
    r = rate;
  }
  FM::OPNB::SetRate(this->chip,clock,r,false);
  FM::OPNB::SetReg(this->chip,0x29,0x9f);
  return;
}

Assistant:

void NP2OPNA<ChipType>::setRate(uint32_t rate, uint32_t clock)
{
    ChipBase::setRate(rate, clock);
    uint32_t chipRate = ChipBase::isRunningAtPcmRate() ? rate : ChipBase::nativeRate();
    chip->SetRate(clock, chipRate, false);  // implies Reset()
    chip->SetReg(0x29, 0x9f);  // enable channels 4-6
}